

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS
ref_cell_list_with2(REF_CELL ref_cell,REF_INT node0,REF_INT node1,REF_INT max_cell,REF_INT *ncell,
                   REF_INT *cell_list)

{
  REF_INT local_50;
  REF_INT local_4c;
  int local_48;
  int local_44;
  int local_40;
  REF_INT cell_node;
  REF_INT item;
  REF_INT cell;
  REF_INT *cell_list_local;
  REF_INT *ncell_local;
  REF_INT max_cell_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_CELL ref_cell_local;
  
  *ncell = 0;
  if ((node0 < 0) || (ref_cell->ref_adj->nnode <= node0)) {
    local_48 = -1;
  }
  else {
    local_48 = ref_cell->ref_adj->first[node0];
  }
  local_40 = local_48;
  if (local_48 == -1) {
    local_4c = -1;
  }
  else {
    local_4c = ref_cell->ref_adj->item[local_48].ref;
  }
  cell_node = local_4c;
  do {
    if (local_40 == -1) {
      return 0;
    }
    for (local_44 = 0; local_44 < ref_cell->node_per; local_44 = local_44 + 1) {
      if (node1 == ref_cell->c2n[local_44 + ref_cell->size_per * cell_node]) {
        if (max_cell <= *ncell) {
          return 7;
        }
        cell_list[*ncell] = cell_node;
        *ncell = *ncell + 1;
      }
    }
    local_40 = ref_cell->ref_adj->item[local_40].next;
    if (local_40 == -1) {
      local_50 = -1;
    }
    else {
      local_50 = ref_cell->ref_adj->item[local_40].ref;
    }
    cell_node = local_50;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cell_list_with2(REF_CELL ref_cell, REF_INT node0,
                                       REF_INT node1, REF_INT max_cell,
                                       REF_INT *ncell, REF_INT *cell_list) {
  REF_INT cell, item, cell_node;

  *ncell = 0;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    if (*ncell >= max_cell) return REF_INCREASE_LIMIT;
    cell_list[*ncell] = cell;
    (*ncell)++;
  }

  return REF_SUCCESS;
}